

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SolverParameter::SharedDtor(SolverParameter *this)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  SolverParameter *pSVar3;
  SolverParameter *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->train_net_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->lr_policy_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->snapshot_prefix_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->net_,psVar1);
  pbVar2 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)_default_regularization_type__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->regularization_type_,pbVar2);
  pbVar2 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)_default_type__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->type_,pbVar2);
  pSVar3 = internal_default_instance();
  if ((this != pSVar3) && (this->train_net_param_ != (NetParameter *)0x0)) {
    (*(this->train_net_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pSVar3 = internal_default_instance();
  if ((this != pSVar3) && (this->net_param_ != (NetParameter *)0x0)) {
    (*(this->net_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pSVar3 = internal_default_instance();
  if ((this != pSVar3) && (this->train_state_ != (NetState *)0x0)) {
    (*(this->train_state_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void SolverParameter::SharedDtor() {
  train_net_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  lr_policy_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  snapshot_prefix_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  net_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  regularization_type_.DestroyNoArena(&SolverParameter::_default_regularization_type_.get());
  type_.DestroyNoArena(&SolverParameter::_default_type_.get());
  if (this != internal_default_instance()) {
    delete train_net_param_;
  }
  if (this != internal_default_instance()) {
    delete net_param_;
  }
  if (this != internal_default_instance()) {
    delete train_state_;
  }
}